

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outdata_reply.c
# Opt level: O1

int mpt_outdata_reply(mpt_outdata *out,size_t len,void *hdr,mpt_message *src)

{
  size_t *psVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  sockaddr *psVar5;
  long lVar6;
  undefined1 *__dest;
  ssize_t sVar7;
  byte bVar8;
  ulong __n;
  mpt_message msg;
  uint8_t tmp [256];
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [264];
  
  if ((out->sock)._id < 0) {
    return -1;
  }
  bVar8 = out->_idlen;
  __n = (ulong)bVar8;
  bVar2 = out->_smax;
  iVar4 = -2;
  if ((len <= bVar2 + __n) && (__n <= len)) {
    if (__n != 0) {
      memcpy(local_138,hdr,__n);
      hdr = (void *)((long)hdr + __n);
    }
    psVar5 = (sockaddr *)0x0;
    if (bVar2 == 0) {
      hdr = psVar5;
    }
    bVar8 = (char)len - bVar8;
    if (bVar8 == 0) {
      hdr = psVar5;
    }
    if (bVar2 == 0) {
      bVar8 = 0;
    }
    if (src == (mpt_message *)0x0) {
      __dest = local_138;
    }
    else {
      local_158 = (undefined4)src->used;
      uStack_154 = *(undefined4 *)((long)&src->used + 4);
      uStack_150 = *(undefined4 *)&src->base;
      uStack_14c = *(undefined4 *)((long)&src->base + 4);
      local_148 = *(undefined4 *)&src->cont;
      uStack_144 = *(undefined4 *)((long)&src->cont + 4);
      uStack_140 = (undefined4)src->clen;
      uStack_13c = *(undefined4 *)((long)&src->clen + 4);
      psVar5 = (sockaddr *)mpt_message_read(&local_158,0x100 - __n,local_138 + __n);
      lVar6 = mpt_message_length(&local_158);
      bVar3 = true;
      if (lVar6 == 0) {
        __dest = local_138;
      }
      else {
        psVar5 = (sockaddr *)(psVar5->sa_data + lVar6 + __n + -2);
        __dest = (undefined1 *)mpt_array_append(out,psVar5,0);
        if (__dest == (undefined1 *)0x0) {
          __dest = (undefined1 *)0x0;
          bVar3 = false;
        }
        else {
          psVar1 = &((out->buf)._buf)->_used;
          *psVar1 = *psVar1 - (long)psVar5;
          if (__n != 0) {
            memcpy(__dest,hdr,__n);
          }
          psVar5 = (sockaddr *)mpt_message_read(&local_158,(long)psVar5 - __n,__dest + __n);
          bVar3 = true;
        }
      }
      if (!bVar3) {
        return -0x11;
      }
    }
    sVar7 = sendto((out->sock)._id,__dest,(size_t)(psVar5->sa_data + (__n - 2)),0,(sockaddr *)hdr,
                   (uint)bVar8);
    iVar4 = -4;
    if (-1 < (int)sVar7) {
      iVar4 = (int)sVar7;
    }
  }
  return iVar4;
}

Assistant:

extern int mpt_outdata_reply(MPT_STRUCT(outdata) *out, size_t len, const void *hdr, const MPT_STRUCT(message) *src)
{
	uint8_t tmp[0x100]; /* 256b reply limit */
	uint8_t *ptr = tmp;
	int ret;
	uint8_t ilen, slen;
	uint16_t max;
	
	/* already answered */
	if (!MPT_socket_active(&out->sock)) {
		return MPT_ERROR(BadArgument);
	}
	ilen = out->_idlen;
	slen = out->_smax;
	max = ilen + slen;
	
	if (len > max || len < ilen) {
		return MPT_ERROR(BadValue);
	}
	if (ilen) {
		memcpy(tmp, hdr, ilen);
		hdr = ((uint8_t *) hdr) + ilen;
	}
	if (!slen || !(slen = len - ilen)) {
		hdr = 0;
	}
	len = 0;
	if (src) {
		MPT_STRUCT(message) msg = *src;
		size_t left;
		len = mpt_message_read(&msg, sizeof(tmp) - ilen, tmp + ilen);
		/* temporary reply limit exceeded */
		if ((left = mpt_message_length(&msg))) {
			len += ilen + left;
			/* use temporary data in unused buffer segment */
			if (!(ptr = mpt_array_append(&out->buf, len, 0))) {
				return MPT_ERROR(MissingBuffer);
			}
			out->buf._buf->_used -= len;
			if (ilen) {
				memcpy(ptr, hdr, ilen);
			}
			len = mpt_message_read(&msg, len - ilen, ptr + ilen);
		}
	}
	ret = sendto(out->sock._id, ptr, ilen + len, 0, hdr, slen);
	
	if (ret < 0) {
		return MPT_ERROR(BadOperation);
	}
	return ret;
}